

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landbasedwheeled.cpp
# Opt level: O2

void __thiscall fp::LandBasedWheeled::PickUp(LandBasedWheeled *this,string *string)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"LandBasedWheeled::Pickup the payload is called\n")
  ;
  poVar1 = std::operator<<(poVar1,(string *)string);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void fp::LandBasedWheeled::PickUp(std::string string) {
    std::cerr << "LandBasedWheeled::Pickup the payload is called\n" << string << std::endl;
}